

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O3

Adjacency_Graph<true> * __thiscall
Disa::Adjacency_Graph<true>::reorder
          (Adjacency_Graph<true> *__return_storage_ptr__,Adjacency_Graph<true> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *permutation)

{
  source_location *psVar1;
  pointer puVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  pointer puVar5;
  double dVar6;
  pointer puVar7;
  pointer puVar8;
  long lVar9;
  pointer puVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  ostream *poVar12;
  source_location *psVar13;
  ulong uVar14;
  long lVar15;
  pointer puVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  size_type __new_size;
  unsigned_long uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  double dVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined **local_110;
  size_type local_108;
  undefined *local_100;
  undefined8 uStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  undefined **local_38;
  
  puVar10 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish;
  puVar16 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start;
  __new_size = (long)puVar10 - (long)puVar16 >> 3;
  psVar13 = (source_location *)
            (permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_start;
  psVar1 = (source_location *)
           (permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar15 = 0;
  if (puVar10 != puVar16) {
    lVar15 = __new_size - 1;
  }
  lVar9 = (long)psVar1 - (long)psVar13 >> 3;
  if (lVar9 == lVar15) {
    dVar6 = 0.0;
    for (; psVar13 != psVar1; psVar13 = psVar13 + 1) {
      dVar6 = dVar6 + ((double)CONCAT44(0x45300000,(int)((ulong)psVar13->_M_impl >> 0x20)) -
                      1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)psVar13->_M_impl) - 4503599627370496.0);
    }
    psVar13 = (source_location *)((lVar9 + -1) * lVar9);
    auVar20._8_4_ = (int)((ulong)psVar13 >> 0x20);
    auVar20._0_8_ = psVar13;
    auVar20._12_4_ = 0x45300000;
    dVar21 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)psVar13) - 4503599627370496.0)) * 0.5;
    if ((dVar6 == dVar21) && (!NAN(dVar6) && !NAN(dVar21))) {
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&__return_storage_ptr__->offset,__new_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&__return_storage_ptr__->vertex_adjacent_list,
                 (long)(this->vertex_adjacent_list).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->vertex_adjacent_list).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      puVar10 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar14 = (long)(this->offset).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar10;
      if (8 < uVar14) {
        puVar16 = (__return_storage_ptr__->offset).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        *puVar16 = 0;
        lVar15 = (long)uVar14 >> 3;
        if (lVar15 != 1) {
          puVar2 = (permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar9 = 1;
          do {
            puVar16[puVar2[lVar9 + -1] + 1] = puVar10[lVar9] - puVar10[lVar9 + -1];
            lVar9 = lVar9 + 1;
          } while (lVar15 != lVar9);
          uVar18 = *puVar16;
          lVar9 = 1;
          do {
            uVar18 = uVar18 + puVar16[lVar9];
            puVar16[lVar9] = uVar18;
            lVar9 = lVar9 + 1;
          } while (lVar15 != lVar9);
        }
      }
      puVar16 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((long)puVar16 - (long)puVar10 != 8 && puVar16 != puVar10) {
        uVar14 = 0;
        do {
          puVar16 = (permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (this->vertex_adjacent_list).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar18 = puVar10[uVar14];
          uVar3 = puVar10[uVar14 + 1];
          puVar10 = (__return_storage_ptr__->vertex_adjacent_list).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar4 = (__return_storage_ptr__->offset).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[puVar16[uVar14]];
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_50,permutation);
          if (uVar18 == uVar3) {
            if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_00124d70;
          }
          else {
            lVar15 = 0;
            do {
              *(unsigned_long *)((long)puVar10 + lVar15 + uVar4 * 8) =
                   local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [*(long *)((long)puVar2 + lVar15 + uVar18 * 8)];
              lVar15 = lVar15 + 8;
            } while (uVar3 * 8 + uVar18 * -8 != lVar15);
LAB_00124d70:
            operator_delete(local_50.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_50.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_50.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar18 = puVar16[uVar14];
          puVar10 = (__return_storage_ptr__->offset).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar3 = puVar10[uVar18];
          uVar18 = puVar10[uVar18 + 1];
          if (uVar3 != uVar18) {
            puVar16 = (__return_storage_ptr__->vertex_adjacent_list).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar10 = puVar16 + uVar3;
            puVar16 = puVar16 + uVar18;
            uVar19 = (long)(uVar18 * 8 + uVar3 * -8) >> 3;
            lVar15 = 0x3f;
            if (uVar19 != 0) {
              for (; uVar19 >> lVar15 == 0; lVar15 = lVar15 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar10,puVar16,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar10,puVar16);
          }
          puVar10 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar16 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (((long)puVar16 - (long)puVar10 != 0) &&
                (uVar14 = uVar14 + 1, uVar14 < ((long)puVar16 - (long)puVar10 >> 3) - 1U));
      }
      puVar2 = (this->vertex_adjacent_list).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar5 = (__return_storage_ptr__->vertex_adjacent_list).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar7 = (this->vertex_adjacent_list).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = (this->vertex_adjacent_list).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (__return_storage_ptr__->vertex_adjacent_list).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar5;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar7;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar8;
      puVar5 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar7 = (__return_storage_ptr__->vertex_adjacent_list).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar8 = (__return_storage_ptr__->offset).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->vertex_adjacent_list).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar2;
      (this->vertex_adjacent_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar7;
      (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar8;
      puVar2 = (__return_storage_ptr__->offset).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (__return_storage_ptr__->offset).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar2;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar10;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar16;
      (__return_storage_ptr__->offset).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar5;
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_110 = &PTR_s__workspace_llm4binary_github_lic_001765a0;
    console_format_abi_cxx11_(&local_f0,(Disa *)0x0,(Log_Level)&local_110,psVar13);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"Checksum for parsed re_ordering failed, are the elements unique?",0x40);
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_38 = &PTR_s__workspace_llm4binary_github_lic_00176588;
    console_format_abi_cxx11_(&local_f0,(Disa *)0x0,(Log_Level)&local_38,psVar13);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__cxx11::to_string
              (&local_b0,
               (long)(permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(permutation->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3);
    std::operator+(&local_90,"Incorrect sizes, ",&local_b0);
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_90," vs. ");
    local_130._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
    paVar17 = &pbVar11->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == paVar17) {
      local_130.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_130.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    }
    local_130._M_string_length = pbVar11->_M_string_length;
    (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar11->_M_string_length = 0;
    (pbVar11->field_2)._M_local_buf[0] = '\0';
    puVar10 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    puVar16 = (this->offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar18 = ((long)puVar10 - (long)puVar16 >> 3) - 1;
    if (puVar10 == puVar16) {
      uVar18 = 0;
    }
    std::__cxx11::to_string(&local_d0,uVar18);
    std::operator+(&local_70,&local_130,&local_d0);
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_70,".");
    local_110 = (undefined **)(pbVar11->_M_dataplus)._M_p;
    paVar17 = &pbVar11->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110 == paVar17) {
      local_100 = (undefined *)paVar17->_M_allocated_capacity;
      uStack_f8 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
      local_110 = &local_100;
    }
    else {
      local_100 = (undefined *)paVar17->_M_allocated_capacity;
    }
    local_108 = pbVar11->_M_string_length;
    (pbVar11->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar11->_M_string_length = 0;
    (pbVar11->field_2)._M_local_buf[0] = '\0';
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(char *)local_110,local_108);
    std::endl<char,std::char_traits<char>>(poVar12);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::~string((string *)&local_f0);
  exit(1);
}

Assistant:

Adjacency_Graph<_directed> Adjacency_Graph<_directed>::reorder(const std::vector<std::size_t>& permutation) {

  ASSERT_DEBUG(permutation.size() == size_vertex(), "Incorrect sizes, " + std::to_string(permutation.size()) + " vs. " +
                                                    std::to_string(size_vertex()) + ".");
  ASSERT_DEBUG(
  std::accumulate(permutation.begin(), permutation.end(), 0.0) == (size_vertex() - 1) * size_vertex() / 2.0,
  "Checksum for parsed re_ordering failed, are the elements unique?");

  // Allocate memory.
  Adjacency_Graph graph;
  graph.offset.resize(offset.size());
  graph.vertex_adjacent_list.resize(vertex_adjacent_list.size());

  // Set up the offsets for the new graph.
  if(!empty()) {
    graph.offset[0] = 0;
    FOR(i_old, size_vertex()) graph.offset[permutation[i_old] + 1] = offset[i_old + 1] - offset[i_old];
    FOR(i_new, size_vertex()) graph.offset[i_new + 1] += graph.offset[i_new];
  }

  // Populate the new graph using the reorder mapping.
  FOR(i_old, size_vertex()) {
    const std::size_t& i_new = permutation[i_old];
    auto adjacency_iter = vertex_adjacency_iter(i_old);
    std::transform(adjacency_iter.first, adjacency_iter.second,
                   std::next(graph.vertex_adjacent_list.begin(), static_cast<s_size_t>(graph.offset[i_new])),
                   [permutation](const std::size_t& i_old) { return permutation[i_old]; });
    adjacency_iter = graph.vertex_adjacency_iter(i_new);
    std::sort(adjacency_iter.first, adjacency_iter.second);
  }

  // swap class data and return.
  this->swap(graph);
  return graph;
}